

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSwap
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *other)

{
  InternalMetadata *this_00;
  uint32 uVar1;
  void *pvVar2;
  ulong uVar3;
  string *psVar4;
  UnknownFieldSet *other_00;
  Arena *arena;
  Arena *arena_00;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_002d73e0;
LAB_002d73d0:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002d73d0;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
LAB_002d73e0:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  RepeatedField<int>::InternalSwap(&this->path_,&other->path_);
  RepeatedField<int>::InternalSwap(&this->span_,&other->span_);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,
             &(other->leading_detached_comments_).super_RepeatedPtrFieldBase);
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar3 = (ulong)arena & 1;
  arena_00 = arena;
  if (uVar3 != 0) {
    arena_00 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->leading_comments_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)
     || ((other->leading_comments_).ptr_ !=
         (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar4 = internal::ArenaStringPtr::Mutable
                       (&this->leading_comments_,
                        (string *)&internal::fixed_address_empty_string_abi_cxx11_,arena_00);
    internal::ArenaStringPtr::Mutable
              (&other->leading_comments_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               arena_00);
    std::__cxx11::string::swap((string *)psVar4);
    arena = (Arena *)this_00->ptr_;
    uVar3 = (ulong)((uint)arena & 1);
  }
  if (uVar3 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->trailing_comments_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_
      ) && ((other->trailing_comments_).ptr_ ==
            (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    return;
  }
  psVar4 = internal::ArenaStringPtr::Mutable
                     (&this->trailing_comments_,
                      (string *)&internal::fixed_address_empty_string_abi_cxx11_,arena);
  internal::ArenaStringPtr::Mutable
            (&other->trailing_comments_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
             arena);
  std::__cxx11::string::swap((string *)psVar4);
  return;
}

Assistant:

void SourceCodeInfo_Location::InternalSwap(SourceCodeInfo_Location* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  span_.InternalSwap(&other->span_);
  leading_detached_comments_.InternalSwap(&other->leading_detached_comments_);
  leading_comments_.Swap(&other->leading_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  trailing_comments_.Swap(&other->trailing_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
}